

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.h
# Opt level: O0

bool __thiscall QSimplexConstraint::isSatisfied(QSimplexConstraint *this)

{
  size_t *psVar1;
  int iVar2;
  bool bVar3;
  double *pdVar4;
  QSimplexVariable **ppQVar5;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  qreal leftHandSide;
  const_iterator iter;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  const_iterator *in_stack_ffffffffffffffa8;
  double dVar7;
  bool local_31;
  double local_30;
  piter local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dVar7 = 0.0;
  local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (piter)QHash<QSimplexVariable_*,_double>::cbegin
                              ((QHash<QSimplexVariable_*,_double> *)0x0);
  while( true ) {
    local_28 = (piter)QHash<QSimplexVariable_*,_double>::cend
                                ((QHash<QSimplexVariable_*,_double> *)in_stack_ffffffffffffffa8);
    bVar3 = QHash<QSimplexVariable_*,_double>::const_iterator::operator!=
                      (in_stack_ffffffffffffffa8,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (!bVar3) break;
    pdVar4 = QHash<QSimplexVariable_*,_double>::const_iterator::value((const_iterator *)0xa5e4a8);
    in_stack_ffffffffffffffa8 = (const_iterator *)*pdVar4;
    ppQVar5 = QHash<QSimplexVariable_*,_double>::const_iterator::key((const_iterator *)0xa5e4bc);
    dVar7 = (double)in_stack_ffffffffffffffa8 * (*ppQVar5)->result + dVar7;
    QHash<QSimplexVariable_*,_double>::const_iterator::operator++(in_RDI);
  }
  psVar1 = &(in_RDI->i).bucket;
  bVar3 = true;
  if ((dVar7 != (double)*psVar1) || (NAN(dVar7) || NAN((double)*psVar1))) {
    local_30 = dVar7 - (double)(in_RDI->i).bucket;
    dVar6 = qAbs<double>(&local_30);
    bVar3 = dVar6 < 1e-07;
  }
  if (bVar3) {
    local_31 = true;
  }
  else {
    iVar2 = *(int *)&in_RDI[1].i.d;
    if (iVar2 == 0) {
      local_31 = dVar7 < (double)(in_RDI->i).bucket;
    }
    else if (iVar2 == 2) {
      psVar1 = &(in_RDI->i).bucket;
      local_31 = (double)*psVar1 <= dVar7 && dVar7 != (double)*psVar1;
    }
    else {
      local_31 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool isSatisfied() {
        qreal leftHandSide(0);

        for (auto iter = variables.cbegin(); iter != variables.cend(); ++iter) {
            leftHandSide += iter.value() * iter.key()->result;
        }

        Q_ASSERT(constant > 0 || qFuzzyCompare(1, 1 + constant));

        if ((leftHandSide == constant) || qAbs(leftHandSide - constant) < 0.0000001)
            return true;

        switch (ratio) {
        case LessOrEqual:
            return leftHandSide < constant;
        case MoreOrEqual:
            return leftHandSide > constant;
        default:
            return false;
        }
    }